

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoSift.c
# Opt level: O3

void reoReorderSift(reo_man *p)

{
  double dVar1;
  uint uVar2;
  reo_plane *prVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  double *pdVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double local_50;
  double local_48;
  double local_40;
  
  uVar12 = (ulong)(uint)p->nSupp;
  if (p->nSupp < 1) {
    __assert_fail("p->nSupp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoSift.c"
                  ,0x37,"void reoReorderSift(reo_man *)");
  }
  if (p->fMinWidth == 0) {
    if (p->fMinApl == 0) {
      local_50 = (double)p->nNodesCur;
    }
    else {
      local_50 = p->nAplCur;
    }
  }
  else {
    local_50 = (double)p->nWidthCur;
  }
  local_40 = (double)((int)(local_50 * 1.15) + 1);
  iVar13 = 0;
  while (iVar7 = (int)uVar12, 0 < iVar7) {
    pdVar6 = p->pVarCosts;
    piVar8 = &p->pPlanes->statsNodes;
    uVar17 = 0xffffffff;
    uVar11 = 0;
    dVar18 = -1.0;
    do {
      pdVar6[uVar11] = 10000000.0;
      if ((((reo_plane *)(piVar8 + -1))->fSifted == 0) && (dVar18 < (double)*piVar8)) {
        uVar17 = uVar11 & 0xffffffff;
        dVar18 = (double)*piVar8;
      }
      uVar11 = uVar11 + 1;
      piVar8 = piVar8 + 0xe;
    } while (uVar12 != uVar11);
    iVar15 = (int)uVar17;
    if (iVar15 == -1) break;
    prVar3 = p->pPlanes;
    lVar10 = (long)iVar15;
    prVar3[lVar10].fSifted = 1;
    p->pVarCosts[lVar10] = local_50;
    prVar3->statsCostAbove = 0.0;
    local_48 = local_50;
    if (iVar15 < (int)(uVar12 >> 1)) {
      if (0 < iVar15) {
        lVar14 = 0;
        do {
          *(double *)((long)&prVar3[1].statsCostAbove + lVar14) =
               *(double *)((long)&prVar3->statsCostAbove + lVar14) +
               *(double *)((long)&prVar3->statsCost + lVar14);
          lVar14 = lVar14 + 0x38;
        } while ((ulong)(iVar15 + 1) * 0x38 + -0x38 != lVar14);
      }
      prVar3[uVar12].statsCostBelow = 0.0;
      if (iVar15 < iVar7) {
        pdVar6 = &prVar3[uVar12].statsCostBelow;
        do {
          uVar12 = uVar12 - 1;
          pdVar6[-7] = *pdVar6 + pdVar6[-2];
          pdVar6 = pdVar6 + -7;
        } while (lVar10 < (long)uVar12);
      }
      dVar18 = prVar3[lVar10].statsCostAbove + prVar3[lVar10].statsCost +
               prVar3[lVar10].statsCostBelow;
      if ((local_50 != dVar18) || (NAN(local_50) || NAN(dVar18))) {
        __assert_fail("CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + p->pPlanes[VarCurrent].statsCost + p->pPlanes[VarCurrent].statsCostBelow"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoSift.c"
                      ,0x76,"void reoReorderSift(reo_man *)");
      }
      if (0 < iVar15) {
        lVar10 = uVar17 * 7 + 5;
        uVar12 = uVar17;
        do {
          uVar11 = uVar12 - 1;
          dVar18 = reoReorderSwapAdjacentVars(p,(int)uVar11,1);
          local_50 = local_50 - dVar18;
          p->pVarCosts[uVar12 - 1] = local_50;
          prVar3 = p->pPlanes;
          dVar18 = *(double *)(&prVar3->fSifted + lVar10 * 2) +
                   *(double *)((long)prVar3 + lVar10 * 8 + -0x10);
          *(double *)(&prVar3[-1].fSifted + lVar10 * 2) = dVar18;
          if ((local_40 <= local_50) ||
             (dVar1 = *(double *)((long)prVar3 + lVar10 * 8 + -0x40),
             local_48 <= dVar18 + (dVar1 + dVar1) / 3.0)) goto LAB_007c7198;
          if (local_50 < local_48) {
            dVar18 = (double)((int)(local_50 * 1.15) + 1);
            if (local_40 <= dVar18) {
              dVar18 = local_40;
            }
            uVar17 = uVar11 & 0xffffffff;
            local_48 = local_50;
            local_40 = dVar18;
          }
          if (((p->fMinWidth != 0) || (p->fMinApl != 0)) && (p->nNodesMaxAlloc * 2 <= p->nNodesCur))
          {
            reoResizeStructures(p,0,p->nNodesCur,0);
          }
          lVar10 = lVar10 + -7;
          bVar4 = 1 < uVar12;
          uVar12 = uVar11;
        } while (bVar4);
        uVar12 = 0;
LAB_007c7198:
        iVar15 = (int)uVar12;
        iVar7 = p->nSupp;
      }
      iVar16 = (int)uVar17;
      iVar9 = iVar15 + -1;
      if (iVar15 == 0) {
        iVar9 = 0;
      }
      if (iVar9 < iVar7 + -1) {
        lVar10 = (long)iVar9;
        lVar14 = lVar10 * 7 + 0xc;
        do {
          iVar7 = iVar9;
          iVar16 = (int)uVar17;
          lVar10 = lVar10 + 1;
          dVar18 = reoReorderSwapAdjacentVars(p,iVar7,0);
          local_50 = local_50 - dVar18;
          pdVar6 = p->pVarCosts;
          dVar18 = pdVar6[lVar10];
          if (((dVar18 != 10000000.0) || (NAN(dVar18))) && (1e-07 < ABS(dVar18 - local_50))) {
            puts("reoReorderSift(): Error! On the backward move, the costs are different.");
            pdVar6 = p->pVarCosts;
          }
          pdVar6[lVar10] = local_50;
          prVar3 = p->pPlanes;
          dVar18 = *(double *)((long)prVar3 + lVar14 * 8 + -0x40) +
                   *(double *)((long)prVar3 + lVar14 * 8 + -0x48);
          *(double *)((long)prVar3 + lVar14 * 8 + -8) = dVar18;
          if ((iVar16 <= lVar10) &&
             ((local_40 <= local_50 ||
              (local_48 <=
               dVar18 + (*(double *)(&prVar3->fSifted + lVar14 * 2) +
                        *(double *)(&prVar3->fSifted + lVar14 * 2)) / 3.0)))) break;
          dVar18 = local_40;
          if (local_50 <= local_48) {
            dVar18 = (double)((int)(local_50 * 1.15) + 1);
            uVar17 = (ulong)(iVar7 + 1);
            local_48 = local_50;
            if (local_40 <= dVar18) {
              dVar18 = local_40;
            }
          }
          local_40 = dVar18;
          iVar16 = (int)uVar17;
          if (((p->fMinWidth != 0) || (p->fMinApl != 0)) && (p->nNodesMaxAlloc * 2 <= p->nNodesCur))
          {
            reoResizeStructures(p,0,p->nNodesCur,0);
          }
          lVar14 = lVar14 + 7;
          iVar9 = iVar7 + 1;
        } while (lVar10 < (long)p->nSupp + -1);
        iVar9 = iVar7 + 1;
      }
      if (iVar9 < iVar16) {
        __assert_fail("q >= BestQ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoSift.c"
                      ,0xcb,"void reoReorderSift(reo_man *)");
      }
      if (iVar16 < iVar9) {
        lVar10 = (long)iVar9;
        do {
          iVar9 = iVar9 + -1;
          dVar18 = reoReorderSwapAdjacentVars(p,iVar9,1);
          local_50 = local_50 - dVar18;
          if (1e-07 < ABS(p->pVarCosts[lVar10 + -1] - local_50)) {
            puts("reoReorderSift():  Error! On the return move, the costs are different.");
            fflush(_stdout);
          }
          lVar10 = lVar10 + -1;
        } while (iVar16 < lVar10);
      }
    }
    else {
      if (0 < iVar15) {
        lVar14 = 0;
        do {
          *(double *)((long)&prVar3[1].statsCostAbove + lVar14) =
               *(double *)((long)&prVar3->statsCostAbove + lVar14) +
               *(double *)((long)&prVar3->statsCost + lVar14);
          lVar14 = lVar14 + 0x38;
        } while ((ulong)(iVar15 + 1) * 0x38 + -0x38 != lVar14);
      }
      prVar3[uVar12].statsCostBelow = 0.0;
      if (iVar15 < iVar7) {
        pdVar6 = &prVar3[uVar12].statsCostBelow;
        do {
          uVar12 = uVar12 - 1;
          pdVar6[-7] = *pdVar6 + pdVar6[-2];
          pdVar6 = pdVar6 + -7;
        } while (lVar10 < (long)uVar12);
      }
      dVar18 = prVar3[lVar10].statsCostAbove + prVar3[lVar10].statsCost +
               prVar3[lVar10].statsCostBelow;
      if ((local_50 != dVar18) || (NAN(local_50) || NAN(dVar18))) {
        __assert_fail("CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + p->pPlanes[VarCurrent].statsCost + p->pPlanes[VarCurrent].statsCostBelow"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoSift.c"
                      ,0xe4,"void reoReorderSift(reo_man *)");
      }
      uVar12 = uVar17;
      if (iVar15 < iVar7 + -1) {
        lVar14 = lVar10 * 7 + 0xc;
        do {
          iVar7 = (int)lVar10;
          dVar18 = reoReorderSwapAdjacentVars(p,iVar7,0);
          local_50 = local_50 - dVar18;
          p->pVarCosts[lVar10 + 1] = local_50;
          prVar3 = p->pPlanes;
          dVar18 = *(double *)((long)prVar3 + lVar14 * 8 + -0x40) +
                   *(double *)((long)prVar3 + lVar14 * 8 + -0x48);
          *(double *)((long)prVar3 + lVar14 * 8 + -8) = dVar18;
          uVar12 = uVar17;
          if ((local_40 <= local_50) ||
             (local_48 <=
              dVar18 + (*(double *)(&prVar3->fSifted + lVar14 * 2) +
                       *(double *)(&prVar3->fSifted + lVar14 * 2)) / 3.0)) break;
          dVar18 = local_40;
          if (local_50 < local_48) {
            dVar18 = (double)((int)(local_50 * 1.15) + 1);
            uVar17 = (ulong)(iVar7 + 1);
            local_48 = local_50;
            if (local_40 <= dVar18) {
              dVar18 = local_40;
            }
          }
          local_40 = dVar18;
          if (((p->fMinWidth != 0) || (p->fMinApl != 0)) && (p->nNodesMaxAlloc * 2 <= p->nNodesCur))
          {
            reoResizeStructures(p,0,p->nNodesCur,0);
          }
          lVar10 = lVar10 + 1;
          lVar14 = lVar14 + 7;
          uVar12 = uVar17;
        } while (lVar10 < (long)p->nSupp + -1);
        uVar17 = (ulong)(iVar7 + 1);
      }
      iVar15 = (int)uVar12;
      iVar7 = (int)uVar17;
      if (0 < iVar7) {
        lVar10 = uVar17 * 7 + 5;
        do {
          iVar15 = (int)uVar12;
          uVar11 = uVar17 - 1;
          dVar18 = reoReorderSwapAdjacentVars(p,(int)uVar11,1);
          local_50 = local_50 - dVar18;
          pdVar6 = p->pVarCosts;
          dVar18 = pdVar6[uVar17 - 1];
          if (((dVar18 != 10000000.0) || (NAN(dVar18))) && (1e-07 < ABS(dVar18 - local_50))) {
            puts("reoReorderSift(): Error! On the backward move, the costs are different.");
            pdVar6 = p->pVarCosts;
          }
          pdVar6[uVar17 - 1] = local_50;
          prVar3 = p->pPlanes;
          dVar18 = *(double *)(&prVar3->fSifted + lVar10 * 2) +
                   *(double *)((long)prVar3 + lVar10 * 8 + -0x10);
          *(double *)(&prVar3[-1].fSifted + lVar10 * 2) = dVar18;
          if (((long)uVar11 <= (long)iVar15) &&
             ((local_40 <= local_50 ||
              (dVar1 = *(double *)((long)prVar3 + lVar10 * 8 + -0x40),
              local_48 <= dVar18 + (dVar1 + dVar1) / 3.0)))) goto LAB_007c754b;
          if (local_50 <= local_48) {
            dVar18 = (double)((int)(local_50 * 1.15) + 1);
            if (local_40 <= dVar18) {
              dVar18 = local_40;
            }
            uVar12 = uVar11 & 0xffffffff;
            local_48 = local_50;
            local_40 = dVar18;
          }
          iVar15 = (int)uVar12;
          if (((p->fMinWidth != 0) || (p->fMinApl != 0)) && (p->nNodesMaxAlloc * 2 <= p->nNodesCur))
          {
            reoResizeStructures(p,0,p->nNodesCur,0);
          }
          lVar10 = lVar10 + -7;
          bVar4 = 1 < uVar17;
          uVar17 = uVar11;
        } while (bVar4);
        uVar17 = 0;
LAB_007c754b:
        iVar7 = (int)uVar17;
      }
      iVar9 = iVar7 + -1;
      if (iVar7 == 0) {
        iVar9 = 0;
      }
      if (iVar15 < iVar9) {
        __assert_fail("q <= BestQ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoSift.c"
                      ,0x139,"void reoReorderSift(reo_man *)");
      }
      if (iVar9 < iVar15) {
        lVar10 = (long)iVar9;
        do {
          dVar18 = reoReorderSwapAdjacentVars(p,(int)lVar10,0);
          local_50 = local_50 - dVar18;
          if (1e-07 < ABS(p->pVarCosts[lVar10 + 1] - local_50)) {
            puts("reoReorderSift(): Error! On the return move, the costs are different.");
            fflush(_stdout);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar15);
      }
    }
    if (1e-07 <= ABS(local_48 - local_50)) {
      __assert_fail("fabs( CostBest - CostCurrent ) < REO_COST_EPSILON",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoSift.c"
                    ,0x145,"void reoReorderSift(reo_man *)");
    }
    if (p->fMinWidth == 0) {
      if (p->fMinApl == 0) {
        p->nNodesCur = (int)local_48;
      }
      else {
        p->nAplCur = local_50;
      }
    }
    else {
      p->nWidthCur = (int)local_48;
    }
    auVar5 = _DAT_007ee2e0;
    iVar13 = iVar13 + 1;
    uVar2 = p->nSupp;
    uVar12 = (ulong)uVar2;
    if ((int)uVar2 <= iVar13) {
      if (0 < (int)uVar2) {
        prVar3 = p->pPlanes;
        lVar10 = uVar12 - 1;
        auVar19._8_4_ = (int)lVar10;
        auVar19._0_8_ = lVar10;
        auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
        lVar10 = 0;
        auVar19 = auVar19 ^ _DAT_007ee2e0;
        auVar20 = _DAT_007ee2c0;
        auVar21 = _DAT_007ee2d0;
        do {
          auVar22 = auVar21 ^ auVar5;
          iVar13 = auVar19._4_4_;
          if ((bool)(~(auVar22._4_4_ == iVar13 && auVar19._0_4_ < auVar22._0_4_ ||
                      iVar13 < auVar22._4_4_) & 1)) {
            *(undefined4 *)((long)&prVar3->fSifted + lVar10) = 0;
          }
          if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
              auVar22._12_4_ <= auVar19._12_4_) {
            *(undefined4 *)((long)&prVar3[1].fSifted + lVar10) = 0;
          }
          auVar22 = auVar20 ^ auVar5;
          iVar7 = auVar22._4_4_;
          if (iVar7 <= iVar13 && (iVar7 != iVar13 || auVar22._0_4_ <= auVar19._0_4_)) {
            *(undefined4 *)((long)&prVar3[2].fSifted + lVar10) = 0;
            *(undefined4 *)((long)&prVar3[3].fSifted + lVar10) = 0;
          }
          lVar14 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 4;
          auVar21._8_8_ = lVar14 + 4;
          lVar14 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 4;
          auVar20._8_8_ = lVar14 + 4;
          lVar10 = lVar10 + 0xe0;
        } while ((ulong)(uVar2 + 3 >> 2) * 0xe0 - lVar10 != 0);
      }
      return;
    }
  }
  __assert_fail("VarCurrent != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoSift.c"
                ,0x5a,"void reoReorderSift(reo_man *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                    FUNCTION DEFINITIONS                          ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Implements the variable sifting algorithm.]

  Description [Performs a sequence of adjacent variable swaps known as "sifting".
  Uses the cost functions determined by the flag.]

  SideEffects []

  SeeAlso     []

***********************************************************************/
void reoReorderSift( reo_man * p )
{
	double CostCurrent;  // the cost of the current permutation
	double CostLimit;    // the maximum increase in cost that can be tolerated
	double CostBest;     // the best cost
	int BestQ;           // the best position
	int VarCurrent;      // the current variable to move   
	int q;               // denotes the current position of the variable
	int c;               // performs the loops over variables until all of them are sifted
	int v;               // used for other purposes

	assert( p->nSupp > 0 );

	// set the current cost depending on the minimization criteria
	if ( p->fMinWidth )
		CostCurrent = p->nWidthCur;
	else if ( p->fMinApl )
		CostCurrent = p->nAplCur;
	else
		CostCurrent = p->nNodesCur;

	// find the upper bound on tbe cost growth
	CostLimit = 1 + (int)(REO_REORDER_LIMIT * CostCurrent);

	// perform sifting for each of p->nSupp variables
	for ( c = 0; c < p->nSupp; c++ )
	{
		// select the current variable to be the one with the largest number of nodes that is not sifted yet
		VarCurrent = -1;
		CostBest   = -1.0;
		for ( v = 0; v < p->nSupp; v++ )
		{
			p->pVarCosts[v] = REO_HIGH_VALUE;
			if ( !p->pPlanes[v].fSifted )
			{
//				VarCurrent = v;
//				if ( CostBest < p->pPlanes[v].statsCost )
				if ( CostBest < p->pPlanes[v].statsNodes )
				{
//					CostBest   = p->pPlanes[v].statsCost;
					CostBest   = p->pPlanes[v].statsNodes;
					VarCurrent = v;
				}

			}
		}
		assert( VarCurrent != -1 );
		// mark this variable as sifted
		p->pPlanes[VarCurrent].fSifted = 1;

		// set the current value
		p->pVarCosts[VarCurrent] = CostCurrent;

		// set the best cost
		CostBest = CostCurrent;
		BestQ    = VarCurrent; 

		// determine which way to move the variable first (up or down)
		// the rationale is that if we move the shorter way first
		// it is more likely that the best position will be found on the longer way
		// and the reverse movement (to take the best position) will be faster
		if ( VarCurrent < p->nSupp/2 ) // move up first, then down
		{
			// set the total cost on all levels above the current level
			p->pPlanes[0].statsCostAbove = 0;
			for ( v = 1; v <= VarCurrent; v++ )
				p->pPlanes[v].statsCostAbove = p->pPlanes[v-1].statsCostAbove + p->pPlanes[v-1].statsCost;
			// set the total cost on all levels below the current level
			p->pPlanes[p->nSupp].statsCostBelow = 0;
			for ( v = p->nSupp - 1; v >= VarCurrent; v-- )
				p->pPlanes[v].statsCostBelow = p->pPlanes[v+1].statsCostBelow + p->pPlanes[v+1].statsCost;

			assert( CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + 
									p->pPlanes[VarCurrent].statsCost +
				                    p->pPlanes[VarCurrent].statsCostBelow );

			// move up
			for ( q = VarCurrent-1; q >= 0; q-- )
			{
				CostCurrent -= reoReorderSwapAdjacentVars( p, q, 1 );
				// now q points to the position of this var in the order
				p->pVarCosts[q] = CostCurrent;
				// update the lower bound (assuming that for level q+1 it is set correctly)
				p->pPlanes[q].statsCostBelow = p->pPlanes[q+1].statsCostBelow + p->pPlanes[q+1].statsCost;
				// check the upper bound
				if ( CostCurrent >= CostLimit )
					break;
				// check the lower bound
				if ( p->pPlanes[q].statsCostBelow + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostAbove/REO_QUAL_PAR >= CostBest )
					break;
				// update the best cost
				if ( CostBest > CostCurrent )
				{
					CostBest = CostCurrent;
					BestQ    = q;
					// adjust node limit
					CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
				}

				// when we are reordering for width or APL, it may happen that
				// the number of nodes has grown above certain limit,
				// in which case we have to resize the data structures
				if ( p->fMinWidth || p->fMinApl )
				{
					if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
					{
//						printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
						reoResizeStructures( p, 0, p->nNodesCur, 0 );
					}
				}
			}
			// fix the plane index
			if ( q == -1 )
				q++;
			// now p points to the position of this var in the order

			// move down
			for ( ; q < p->nSupp-1; )
			{
				CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
				q++;    // change q to point to the position of this var in the order
				// sanity check: the number of nodes on the back pass should be the same
				if ( p->pVarCosts[q] != REO_HIGH_VALUE && fabs( p->pVarCosts[q] - CostCurrent ) > REO_COST_EPSILON )
					printf("reoReorderSift(): Error! On the backward move, the costs are different.\n");
				p->pVarCosts[q] = CostCurrent;
				// update the lower bound (assuming that for level q-1 it is set correctly)
				p->pPlanes[q].statsCostAbove = p->pPlanes[q-1].statsCostAbove + p->pPlanes[q-1].statsCost;
				// check the bounds only if the variable already reached its previous position
				if ( q >= BestQ )
				{
					// check the upper bound
					if ( CostCurrent >= CostLimit )
						break;
					// check the lower bound
					if ( p->pPlanes[q].statsCostAbove + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostBelow/REO_QUAL_PAR >= CostBest )
						break;
				}
				// update the best cost
				if ( CostBest >= CostCurrent )
				{
					CostBest = CostCurrent;
					BestQ    = q;
					// adjust node limit
					CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
				}

				// when we are reordering for width or APL, it may happen that
				// the number of nodes has grown above certain limit,
				// in which case we have to resize the data structures
				if ( p->fMinWidth || p->fMinApl )
				{
					if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
					{
//						printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
						reoResizeStructures( p, 0, p->nNodesCur, 0 );
					}
				}
			}
			// move the variable up from the given position (q) to the best position (BestQ)
			assert( q >= BestQ );
			for ( ; q > BestQ; q-- )
			{
				CostCurrent -= reoReorderSwapAdjacentVars( p, q-1, 1 );
				// sanity check: the number of nodes on the back pass should be the same
				if ( fabs( p->pVarCosts[q-1] - CostCurrent ) > REO_COST_EPSILON )
				{
					printf("reoReorderSift():  Error! On the return move, the costs are different.\n" );
					fflush(stdout);
				}
			}
		}
		else // move down first, then up
		{
			// set the current number of nodes on all levels above the given level
			p->pPlanes[0].statsCostAbove = 0;
			for ( v = 1; v <= VarCurrent; v++ )
				p->pPlanes[v].statsCostAbove = p->pPlanes[v-1].statsCostAbove + p->pPlanes[v-1].statsCost;
			// set the current number of nodes on all levels below the given level
			p->pPlanes[p->nSupp].statsCostBelow = 0;
			for ( v = p->nSupp - 1; v >= VarCurrent; v-- )
				p->pPlanes[v].statsCostBelow = p->pPlanes[v+1].statsCostBelow + p->pPlanes[v+1].statsCost;
			
			assert( CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + 
									p->pPlanes[VarCurrent].statsCost +
				                    p->pPlanes[VarCurrent].statsCostBelow );

			// move down
			for ( q = VarCurrent; q < p->nSupp-1; )
			{
				CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
				q++;    // change q to point to the position of this var in the order
				p->pVarCosts[q] = CostCurrent;
				// update the lower bound (assuming that for level q-1 it is set correctly)
				p->pPlanes[q].statsCostAbove = p->pPlanes[q-1].statsCostAbove + p->pPlanes[q-1].statsCost;
				// check the upper bound
				if ( CostCurrent >= CostLimit )
					break;
				// check the lower bound
				if ( p->pPlanes[q].statsCostAbove + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostBelow/REO_QUAL_PAR >= CostBest )
					break;
				// update the best cost
				if ( CostBest > CostCurrent )
				{
					CostBest = CostCurrent;
					BestQ    = q;
					// adjust node limit
					CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
				}

				// when we are reordering for width or APL, it may happen that
				// the number of nodes has grown above certain limit,
				// in which case we have to resize the data structures
				if ( p->fMinWidth || p->fMinApl )
				{
					if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
					{
//						printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
						reoResizeStructures( p, 0, p->nNodesCur, 0 );
					}
				}
			}

			// move up
			for ( --q; q >= 0; q-- )
			{
				CostCurrent -= reoReorderSwapAdjacentVars( p, q, 1 );
				// now q points to the position of this var in the order
				// sanity check: the number of nodes on the back pass should be the same
				if ( p->pVarCosts[q] != REO_HIGH_VALUE && fabs( p->pVarCosts[q] - CostCurrent ) > REO_COST_EPSILON )
					printf("reoReorderSift(): Error! On the backward move, the costs are different.\n");
				p->pVarCosts[q] = CostCurrent;
				// update the lower bound (assuming that for level q+1 it is set correctly)
				p->pPlanes[q].statsCostBelow = p->pPlanes[q+1].statsCostBelow + p->pPlanes[q+1].statsCost;
				// check the bounds only if the variable already reached its previous position
				if ( q <= BestQ )
				{
					// check the upper bound
					if ( CostCurrent >= CostLimit )
						break;
					// check the lower bound
					if ( p->pPlanes[q].statsCostBelow + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostAbove/REO_QUAL_PAR >= CostBest )
						break;
				}
				// update the best cost
				if ( CostBest >= CostCurrent )
				{
					CostBest = CostCurrent;
					BestQ    = q;
					// adjust node limit
					CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
				}

				// when we are reordering for width or APL, it may happen that
				// the number of nodes has grown above certain limit,
				// in which case we have to resize the data structures
				if ( p->fMinWidth || p->fMinApl )
				{
					if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
					{
//						printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
						reoResizeStructures( p, 0, p->nNodesCur, 0 );
					}
				}
			}
			// fix the plane index
			if ( q == -1 )
				q++;
			// now q points to the position of this var in the order
			// move the variable down from the given position (q) to the best position (BestQ)
			assert( q <= BestQ );
			for ( ; q < BestQ; q++ )
			{
				CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
				// sanity check: the number of nodes on the back pass should be the same
				if ( fabs( p->pVarCosts[q+1] - CostCurrent ) > REO_COST_EPSILON )
				{
					printf("reoReorderSift(): Error! On the return move, the costs are different.\n" );
					fflush(stdout);
				}
			}
		}
		assert( fabs( CostBest - CostCurrent ) < REO_COST_EPSILON );

		// update the cost 
		if ( p->fMinWidth )
			p->nWidthCur = (int)CostBest;
		else if ( p->fMinApl )
			p->nAplCur = CostCurrent;
		else
			p->nNodesCur = (int)CostBest;
	}

	// remove the sifted attributes if any
	for ( v = 0; v < p->nSupp; v++ )
		p->pPlanes[v].fSifted = 0;
}